

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

char * zt_cstr_chomp(char *str)

{
  size_t sVar1;
  
  sVar1 = strlen(str);
  if (str[sVar1 - 1] == '\n') {
    str[sVar1 - 1] = '\0';
  }
  return str;
}

Assistant:

char*
zt_cstr_chomp(char *str) {
    zt_assert(str);
    {
        size_t    i = 0;

        i = strlen(str);
        if (str[i - 1] == '\n') {
            str[i - 1] = '\0';
        }
    }
    return str;
}